

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVset_attr_list(CManager_conflict cm,EVstone stone_id,attr_list stone_attrs)

{
  stone_type p_Var1;
  
  p_Var1 = stone_struct(cm->evp,stone_id);
  if (p_Var1 != (stone_type)0x0) {
    if (p_Var1->stone_attrs != (attr_list)0x0) {
      free_attr_list();
    }
    p_Var1->stone_attrs = stone_attrs;
    add_ref_attr_list(stone_attrs);
    return;
  }
  return;
}

Assistant:

extern void
INT_EVset_attr_list(CManager cm, EVstone stone_id, attr_list stone_attrs)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    stone = stone_struct(evp, stone_id);
    if (!stone) return;
    if (stone->stone_attrs) free_attr_list(stone->stone_attrs);
    stone->stone_attrs = stone_attrs;
    add_ref_attr_list(stone_attrs);
}